

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.hpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::
GetId<ot::commissioner::persistent_storage::Registrar,ot::commissioner::persistent_storage::RegistrarId>
          (PersistentStorageJson *this,RegistrarId *aId,Registrar *aRet,string *aArrName)

{
  bool bVar1;
  reference pvVar2;
  reference this_00;
  Registrar local_100;
  iterator local_b8;
  RegistrarId *local_98;
  iterator local_90;
  iterator local_70;
  undefined1 local_50 [8];
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  itValue;
  string *aArrName_local;
  Registrar *aRet_local;
  RegistrarId *aId_local;
  PersistentStorageJson *this_local;
  
  itValue.m_it.primitive_iterator.m_it = (difference_type)aArrName;
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](&this->mCache,aArrName);
  std::
  begin<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (&local_70,pvVar2);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](&this->mCache,aArrName);
  std::
  end<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (&local_90,pvVar2);
  local_98 = aId;
  std::
  find_if<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,ot::commissioner::persistent_storage::PersistentStorageJson::GetId<ot::commissioner::persistent_storage::Registrar,ot::commissioner::persistent_storage::RegistrarId>(ot::commissioner::persistent_storage::RegistrarId_const&,ot::commissioner::persistent_storage::Registrar&,std::__cxx11::string)::_lambda(ot::commissioner::persistent_storage::Registrar_const&)_1_>
            ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)local_50,&local_70,&local_90,(anon_class_8_1_ba1d30bc_for__M_pred)aId);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](&this->mCache,aArrName);
  std::
  end<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (&local_b8,pvVar2);
  bVar1 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_50,&local_b8);
  if (!bVar1) {
    this_00 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)local_50);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator_Registrar<ot::commissioner::persistent_storage::Registrar,_0>(&local_100,this_00);
    Registrar::operator=(aRet,&local_100);
    Registrar::~Registrar(&local_100);
  }
  return bVar1;
}

Assistant:

Status GetId(I const &aId, V &aRet, std::string aArrName)
    {
        auto itValue = std::find_if(std::begin(mCache[aArrName]), std::end(mCache[aArrName]),
                                    [&aId](V const &el) { return el.mId.mId == aId.mId; });
        if (itValue == std::end(mCache[aArrName]))
        {
            return Status::kNotFound;
        }

        aRet = *itValue;

        return Status::kSuccess;
    }